

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_checkingOwningModelWithUnitBaseOnlyInModel_Test::
~Units_checkingOwningModelWithUnitBaseOnlyInModel_Test
          (Units_checkingOwningModelWithUnitBaseOnlyInModel_Test *this)

{
  Units_checkingOwningModelWithUnitBaseOnlyInModel_Test *this_local;
  
  ~Units_checkingOwningModelWithUnitBaseOnlyInModel_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, checkingOwningModelWithUnitBaseOnlyInModel)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("apple");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("apple", "kilo", 2.0, 0.001); // standard, exponent.
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("apple", "kilo", 4.0, 0.001); // standard, exponent.

    model->addUnits(u);
    model->addUnits(u1);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}